

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu382_com.c
# Opt level: O3

void vdpu382_setup_statistic(Vdpu382RegCommon *com,Vdpu382RegStatistic *sta)

{
  undefined1 *puVar1;
  
  puVar1 = &(com->reg011).field_0x3;
  *puVar1 = *puVar1 | 1;
  sta->reg270 = (SWREG270_DEBUG_QOS_CTRL_conflict)0x0;
  sta->reg271_wr_wait_cycle_qos = 0;
  sta->reg272 = (SWREG272_DEBUG_INT_conflict)0x0;
  sta->reg273 = (SWREG273_conflict)0x0;
  sta->reg274_y_min_value = 0;
  sta->reg274_y_max_value = 0;
  sta->reg275_u_min_value = 0;
  sta->reg275_u_max_value = 0;
  sta->reg276_v_min_value = 0;
  sta->reg276_v_max_value = 0;
  sta->reg277 = (SWREG277_ERROR_SPREAD_NUM)0x0;
  sta->reg266_perf_cnt0 = 0;
  sta->reg267_perf_cnt1 = 0;
  sta->reg268_perf_cnt2 = 0;
  sta->reserve_reg269 = 0;
  sta->reg262_perf_wr_axi_total_byte = 0;
  sta->reg263_perf_working_cnt = 0;
  sta->reg264 = (SWREG264_DEBUG_BUS_STATE)0x0;
  sta->reg265 = (anon_union_4_2_56c2bd2e_for_reg265)0x0;
  sta->reg258 = (SWREG258_DEBUG_PERF_RD_MAX_LATENCY_NUM)0x0;
  sta->reg259_rd_latency_thr_num_ch0 = 0;
  sta->reg260_rd_latency_acc_sum = 0;
  sta->reg261_perf_rd_axi_total_byte = 0;
  sta->reg256 = (SWREG256_DEBUG_PERF_LATENCY_CTRL0)0xb;
  sta->reg257 = (SWREG257_DEBUG_PERF_LATENCY_CTRL1)0x1;
  sta->reg270 = (SWREG270_DEBUG_QOS_CTRL_conflict)0x331100ff;
  return;
}

Assistant:

void vdpu382_setup_statistic(Vdpu382RegCommon *com, Vdpu382RegStatistic *sta)
{
    com->reg011.pix_range_detection_e = 1;

    memset(sta, 0, sizeof(*sta));

    sta->reg256.axi_perf_work_e = 1;
    sta->reg256.axi_perf_clr_e = 1;
    sta->reg256.axi_cnt_type = 1;

    sta->reg257.addr_align_type = 1;

    /* set hurry */
    sta->reg270.axi_rd_hurry_level = 3;
    sta->reg270.axi_wr_hurry_level = 1;
    sta->reg270.axi_wr_qos = 1;
    sta->reg270.axi_rd_qos = 3;
    sta->reg270.bus2mc_buffer_qos_level = 255;
    sta->reg271_wr_wait_cycle_qos = 0;
}